

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5VocabColumnMethod(sqlite3_vtab_cursor *pCursor,sqlite3_context *pCtx,int iCol)

{
  int iVar1;
  sqlite3_vtab *psVar2;
  sqlite3_module *psVar3;
  _func_int_sqlite3_vtab_ptr *p_Var4;
  uint uVar5;
  ulong uVar6;
  _func_void_void_ptr *xDel;
  int iVar7;
  
  if (iCol == 0) {
    psVar2 = pCursor[0xb].pVtab;
    iVar7 = *(int *)&pCursor[0xc].pVtab;
    xDel = (_func_void_void_ptr *)0xffffffffffffffff;
    goto LAB_001c43bf;
  }
  iVar7 = pCursor->pVtab[2].nRef;
  if (iVar7 == 1) {
    if (iCol == 1) {
      psVar2 = pCursor[9].pVtab;
    }
    else {
      psVar2 = pCursor[8].pVtab;
    }
  }
  else {
    psVar3 = pCursor[2].pVtab[1].pModule;
    iVar1 = *(int *)((long)&psVar3->xColumn + 4);
    if (iVar7 != 0) {
      if (iCol != 2) {
        if (iCol != 1) {
          if (iVar1 != 0) {
            return 0;
          }
          sqlite3_result_int(pCtx,*(uint *)&pCursor[0xd].pVtab & 0x7fffffff);
          return 0;
        }
        psVar3 = (pCursor[4].pVtab)->pModule;
        goto LAB_001c440c;
      }
      if (iVar1 == 2) {
        uVar5 = (uint)pCursor[0xd].pVtab;
      }
      else {
        if (iVar1 != 0) {
          return 0;
        }
        uVar5 = *(uint *)((long)&pCursor[0xd].pVtab + 4);
      }
      if ((int)uVar5 < 0) {
        return 0;
      }
      if (*(int *)&psVar3->xBestIndex <= (int)uVar5) {
        return 0;
      }
      p_Var4 = psVar3->xDisconnect;
      uVar6 = (ulong)(uVar5 & 0x7fffffff);
LAB_001c4458:
      psVar2 = *(sqlite3_vtab **)(p_Var4 + uVar6 * 8);
      iVar7 = -1;
      xDel = (_func_void_void_ptr *)0x0;
LAB_001c43bf:
      sqlite3_result_text(pCtx,(char *)psVar2,iVar7,xDel);
      return 0;
    }
    if (iCol == 2) {
      psVar2 = (sqlite3_vtab *)(&(pCursor[9].pVtab)->pModule + *(int *)&pCursor[7].pVtab);
    }
    else {
      if (iCol == 1) {
        if (iVar1 == 1) {
          return 0;
        }
        p_Var4 = psVar3->xDisconnect;
        uVar6 = (ulong)*(int *)&pCursor[7].pVtab;
        goto LAB_001c4458;
      }
      psVar2 = (sqlite3_vtab *)(&(pCursor[8].pVtab)->pModule + *(int *)&pCursor[7].pVtab);
    }
  }
  psVar3 = psVar2->pModule;
  if ((long)psVar3 < 1) {
    return 0;
  }
LAB_001c440c:
  sqlite3_result_int64(pCtx,(i64)psVar3);
  return 0;
}

Assistant:

static int fts5VocabColumnMethod(
  sqlite3_vtab_cursor *pCursor,   /* Cursor to retrieve value from */
  sqlite3_context *pCtx,          /* Context for sqlite3_result_xxx() calls */
  int iCol                        /* Index of column to read value from */
){
  Fts5VocabCursor *pCsr = (Fts5VocabCursor*)pCursor;
  int eDetail = pCsr->pFts5->pConfig->eDetail;
  int eType = ((Fts5VocabTable*)(pCursor->pVtab))->eType;
  i64 iVal = 0;

  if( iCol==0 ){
    sqlite3_result_text(
        pCtx, (const char*)pCsr->term.p, pCsr->term.n, SQLITE_TRANSIENT
    );
  }else if( eType==FTS5_VOCAB_COL ){
    assert( iCol==1 || iCol==2 || iCol==3 );
    if( iCol==1 ){
      if( eDetail!=FTS5_DETAIL_NONE ){
        const char *z = pCsr->pFts5->pConfig->azCol[pCsr->iCol];
        sqlite3_result_text(pCtx, z, -1, SQLITE_STATIC);
      }
    }else if( iCol==2 ){
      iVal = pCsr->aDoc[pCsr->iCol];
    }else{
      iVal = pCsr->aCnt[pCsr->iCol];
    }
  }else if( eType==FTS5_VOCAB_ROW ){
    assert( iCol==1 || iCol==2 );
    if( iCol==1 ){
      iVal = pCsr->aDoc[0];
    }else{
      iVal = pCsr->aCnt[0];
    }
  }else{
    assert( eType==FTS5_VOCAB_INSTANCE );
    switch( iCol ){
      case 1:
        sqlite3_result_int64(pCtx, pCsr->pIter->iRowid);
        break;
      case 2: {
        int ii = -1;
        if( eDetail==FTS5_DETAIL_FULL ){
          ii = FTS5_POS2COLUMN(pCsr->iInstPos);
        }else if( eDetail==FTS5_DETAIL_COLUMNS ){
          ii = (int)pCsr->iInstPos;
        }
        if( ii>=0 && ii<pCsr->pFts5->pConfig->nCol ){
          const char *z = pCsr->pFts5->pConfig->azCol[ii];
          sqlite3_result_text(pCtx, z, -1, SQLITE_STATIC);
        }
        break;
      }
      default: {
        assert( iCol==3 );
        if( eDetail==FTS5_DETAIL_FULL ){
          int ii = FTS5_POS2OFFSET(pCsr->iInstPos);
          sqlite3_result_int(pCtx, ii);
        }
        break;
      }
    }
  }

  if( iVal>0 ) sqlite3_result_int64(pCtx, iVal);
  return SQLITE_OK;
}